

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server2.cpp
# Opt level: O3

void threadFunc(int id,int new_fd,bool *finished,bool *msgFlags,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *msgs,vector<cUser,_std::allocator<cUser>_> *currUsers)

{
  size_type *psVar1;
  pointer pcVar2;
  pointer paVar3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *msgs_00;
  undefined8 uVar4;
  pollfd pVar5;
  int iVar6;
  string *psVar7;
  ssize_t sVar8;
  ostream *poVar9;
  _Alloc_hider _Var10;
  string *unaff_R12;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  char cVar12;
  __normal_iterator<cUser_*,_std::vector<cUser,_std::allocator<cUser>_>_> _Var13;
  undefined8 __position;
  long lVar14;
  pointer paVar15;
  bool bVar16;
  pollfd local_190 [2];
  undefined1 local_180 [8];
  undefined8 local_178;
  string local_170;
  string local_150;
  string local_130;
  undefined1 *local_110;
  long local_108;
  undefined1 local_100 [16];
  pollfd local_f0;
  pollfd pollData [1];
  undefined1 *local_e0;
  long local_d8;
  undefined1 local_d0 [16];
  pollfd local_c0;
  long local_b8;
  undefined1 local_b0 [8];
  undefined8 local_a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_a0;
  bool *local_98;
  long local_90;
  vector<cUser,_std::allocator<cUser>_> *local_88;
  undefined1 local_80 [8];
  string currUser;
  size_type *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  
  local_80 = (undefined1  [8])&currUser._M_string_length;
  currUser._M_dataplus._M_p = (pointer)0x0;
  currUser._M_string_length._0_1_ = 0;
  local_f0.events = 1;
  local_90 = CONCAT44(local_90._4_4_,id);
  currUser.field_2._8_8_ = SEXT48(id);
  bVar16 = false;
  local_f0.fd = new_fd;
  local_a0 = msgs;
  local_98 = msgFlags;
  local_88 = currUsers;
LAB_00104cc6:
  while( true ) {
    msgs_00 = local_a0;
    if (!bVar16) {
      while( true ) {
        sVar8 = send(new_fd,"Use Command Login To Login:",0x1c,0);
        if (sVar8 == -1) {
          perror("send");
        }
        unaff_R12 = getCommand_abi_cxx11_(new_fd,&local_f0,local_98,(int)local_90);
        if (unaff_R12 == (string *)0x0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"connection with host lost",0x19);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
          std::ostream::put('h');
          std::ostream::flush();
          goto LAB_001051df;
        }
        local_58 = &__str._M_string_length;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"login","");
        pcVar2 = (pointer)unaff_R12->_M_string_length;
        if ((pcVar2 == __str._M_dataplus._M_p) &&
           ((pcVar2 == (pointer)0x0 ||
            (iVar6 = bcmp((unaff_R12->_M_dataplus)._M_p,local_58,(size_t)pcVar2), iVar6 == 0)))) {
          local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
          pcVar2 = unaff_R12[1]._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_170,pcVar2,pcVar2 + unaff_R12[1]._M_string_length);
          iVar6 = login(&local_170,new_fd,(string *)local_80,local_88,(int)local_90,local_98,msgs_00
                       );
          cVar12 = (char)iVar6;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_170._M_dataplus._M_p != &local_170.field_2) {
            operator_delete(local_170._M_dataplus._M_p);
          }
        }
        else {
          cVar12 = '\0';
        }
        if (local_58 != &__str._M_string_length) {
          operator_delete(local_58);
        }
        if (cVar12 != '\0') break;
        send(new_fd,"Server: Denied. Please login first.",0x28,0);
      }
    }
    psVar7 = getCommand_abi_cxx11_(new_fd,&local_f0,local_98,(int)local_90);
    if (psVar7 == (string *)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Client connection lost",0x16);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
      std::ostream::put('h');
      std::ostream::flush();
      goto LAB_00105250;
    }
    local_58 = &__str._M_string_length;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"newuser","");
    psVar1 = local_58;
    pcVar2 = (pointer)psVar7->_M_string_length;
    if (pcVar2 == __str._M_dataplus._M_p) {
      if (pcVar2 == (pointer)0x0) {
        bVar16 = true;
      }
      else {
        iVar6 = bcmp((psVar7->_M_dataplus)._M_p,local_58,(size_t)pcVar2);
        bVar16 = iVar6 == 0;
      }
    }
    else {
      bVar16 = false;
    }
    if (psVar1 != &__str._M_string_length) {
      operator_delete(psVar1);
    }
    if (!bVar16) break;
    local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
    pcVar2 = psVar7[1]._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_150,pcVar2,pcVar2 + psVar7[1]._M_string_length);
    newUser(&local_150,new_fd);
    psVar7 = &local_150;
    _Var10._M_p = local_150._M_dataplus._M_p;
LAB_00104ee7:
    bVar16 = true;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var10._M_p != &psVar7->field_2) {
      operator_delete(_Var10._M_p);
    }
  }
  local_58 = &__str._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"msg","");
  psVar1 = local_58;
  pcVar2 = (pointer)psVar7->_M_string_length;
  if (pcVar2 == __str._M_dataplus._M_p) {
    if (pcVar2 == (pointer)0x0) {
      bVar16 = true;
    }
    else {
      iVar6 = bcmp((psVar7->_M_dataplus)._M_p,local_58,(size_t)pcVar2);
      bVar16 = iVar6 == 0;
    }
  }
  else {
    bVar16 = false;
  }
  if (psVar1 != &__str._M_string_length) {
    operator_delete(psVar1);
  }
  if (bVar16) {
    sVar8 = send(new_fd,(local_a0->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start[currUser.field_2._8_8_].
                        _M_dataplus._M_p,0xff,0);
    if (sVar8 == -1) {
      perror("send error");
    }
    local_98[currUser.field_2._8_8_] = false;
    bVar16 = true;
    goto LAB_00104cc6;
  }
  local_58 = &__str._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"who","");
  psVar1 = local_58;
  pcVar2 = (pointer)psVar7->_M_string_length;
  if (pcVar2 == __str._M_dataplus._M_p) {
    if (pcVar2 == (pointer)0x0) {
      bVar16 = true;
    }
    else {
      iVar6 = bcmp((psVar7->_M_dataplus)._M_p,local_58,(size_t)pcVar2);
      bVar16 = iVar6 == 0;
    }
  }
  else {
    bVar16 = false;
  }
  if (psVar1 != &__str._M_string_length) {
    operator_delete(psVar1);
  }
  if (bVar16) {
    bVar16 = true;
    who(local_88,new_fd);
    goto LAB_00104cc6;
  }
  local_58 = &__str._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"send","");
  psVar1 = local_58;
  pcVar2 = (pointer)psVar7->_M_string_length;
  if (pcVar2 == __str._M_dataplus._M_p) {
    if (pcVar2 == (pointer)0x0) {
      bVar16 = true;
    }
    else {
      iVar6 = bcmp((psVar7->_M_dataplus)._M_p,local_58,(size_t)pcVar2);
      bVar16 = iVar6 == 0;
    }
  }
  else {
    bVar16 = false;
  }
  if (psVar1 != &__str._M_string_length) {
    operator_delete(psVar1);
  }
  if (bVar16) {
    local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
    pcVar2 = psVar7[1]._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_130,pcVar2,pcVar2 + psVar7[1]._M_string_length);
    sendMessage(&local_130,new_fd,(string *)local_80,local_88,local_98,local_a0);
    psVar7 = &local_130;
    _Var10._M_p = local_130._M_dataplus._M_p;
    goto LAB_00104ee7;
  }
  local_58 = &__str._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"logout","");
  psVar1 = local_58;
  pcVar2 = (pointer)psVar7->_M_string_length;
  if (pcVar2 == __str._M_dataplus._M_p) {
    if (pcVar2 == (pointer)0x0) {
      bVar16 = true;
    }
    else {
      iVar6 = bcmp((psVar7->_M_dataplus)._M_p,local_58,(size_t)pcVar2);
      bVar16 = iVar6 == 0;
    }
  }
  else {
    bVar16 = false;
  }
  if (psVar1 != &__str._M_string_length) {
    operator_delete(psVar1);
  }
  if (!bVar16) {
    sVar8 = send(new_fd,"Invalid Command",0x14,0);
    bVar16 = true;
    if (sVar8 == -1) {
      perror("send");
    }
    goto LAB_00104cc6;
  }
  sVar8 = send(new_fd,"You are now loged out",0x19,0);
  if (sVar8 == -1) {
    perror("send");
  }
  psVar1 = &__str._M_string_length;
  local_58 = psVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,local_80,currUser._M_dataplus._M_p + (long)local_80);
  std::__cxx11::string::append((char *)&local_58);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)local_58,(long)__str._M_dataplus._M_p);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
  std::ostream::put((char)poVar9);
  std::ostream::flush();
  if (local_58 != psVar1) {
    operator_delete(local_58);
  }
  _Var13._M_current =
       (local_88->super__Vector_base<cUser,_std::allocator<cUser>_>)._M_impl.super__Vector_impl_data
       ._M_start;
  currUser.field_2._8_8_ =
       (local_88->super__Vector_base<cUser,_std::allocator<cUser>_>)._M_impl.super__Vector_impl_data
       ._M_finish;
  local_110 = local_100;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_110,local_80,currUser._M_dataplus._M_p + (long)local_80);
  local_c0 = (pollfd)local_b0;
  std::__cxx11::string::_M_construct<char*>((string *)&local_c0,local_110,local_110 + local_108);
  lVar14 = local_b8;
  local_190[0] = local_c0;
  pVar5 = (pollfd)local_b0;
  if (local_c0 == (pollfd)local_b0) {
    local_178 = local_a8;
    local_190[0] = (pollfd)local_180;
    pVar5 = local_c0;
  }
  local_c0 = pVar5;
  local_b0[0] = 0;
  local_b8 = 0;
  pollData[0] = (pollfd)local_180;
  local_e0 = local_d0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_e0,local_190[0],(undefined1 *)(lVar14 + (long)local_190[0]));
  local_58 = psVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_58,local_e0,local_e0 + local_d8);
  local_90 = currUser.field_2._8_8_ - (long)_Var13._M_current;
  lVar14 = (local_90 >> 3) * -0x3333333333333333 >> 2;
  if (0 < lVar14) {
    lVar14 = lVar14 + 1;
    do {
      bVar16 = __gnu_cxx::__ops::
               _Iter_pred<threadFunc(int,int,bool*,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<cUser,std::allocator<cUser>>&)::$_0>
               ::operator()((_Iter_pred<threadFunc(int,int,bool*,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<cUser,std::allocator<cUser>>&)::__0>
                             *)&local_58,_Var13);
      __position = _Var13._M_current;
      if (bVar16) goto LAB_00105577;
      bVar16 = __gnu_cxx::__ops::
               _Iter_pred<threadFunc(int,int,bool*,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<cUser,std::allocator<cUser>>&)::$_0>
               ::operator()((_Iter_pred<threadFunc(int,int,bool*,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<cUser,std::allocator<cUser>>&)::__0>
                             *)&local_58,_Var13._M_current + 1);
      __position = _Var13._M_current + 1;
      if (bVar16) goto LAB_00105577;
      bVar16 = __gnu_cxx::__ops::
               _Iter_pred<threadFunc(int,int,bool*,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<cUser,std::allocator<cUser>>&)::$_0>
               ::operator()((_Iter_pred<threadFunc(int,int,bool*,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<cUser,std::allocator<cUser>>&)::__0>
                             *)&local_58,_Var13._M_current + 2);
      __position = _Var13._M_current + 2;
      if (bVar16) goto LAB_00105577;
      bVar16 = __gnu_cxx::__ops::
               _Iter_pred<threadFunc(int,int,bool*,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<cUser,std::allocator<cUser>>&)::$_0>
               ::operator()((_Iter_pred<threadFunc(int,int,bool*,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<cUser,std::allocator<cUser>>&)::__0>
                             *)&local_58,_Var13._M_current + 3);
      __position = _Var13._M_current + 3;
      if (bVar16) goto LAB_00105577;
      _Var13._M_current = _Var13._M_current + 4;
      lVar14 = lVar14 + -1;
      local_90 = local_90 + -0xa0;
    } while (1 < lVar14);
  }
  lVar14 = (local_90 >> 3) * -0x3333333333333333;
  if (lVar14 != 1) {
    if (lVar14 != 2) {
      __position = currUser.field_2._8_8_;
      if ((lVar14 != 3) ||
         (bVar16 = __gnu_cxx::__ops::
                   _Iter_pred<threadFunc(int,int,bool*,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<cUser,std::allocator<cUser>>&)::$_0>
                   ::operator()((_Iter_pred<threadFunc(int,int,bool*,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<cUser,std::allocator<cUser>>&)::__0>
                                 *)&local_58,_Var13), __position = _Var13._M_current, bVar16))
      goto LAB_00105577;
      _Var13._M_current = _Var13._M_current + 1;
    }
    bVar16 = __gnu_cxx::__ops::
             _Iter_pred<threadFunc(int,int,bool*,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<cUser,std::allocator<cUser>>&)::$_0>
             ::operator()((_Iter_pred<threadFunc(int,int,bool*,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<cUser,std::allocator<cUser>>&)::__0>
                           *)&local_58,_Var13);
    __position = _Var13._M_current;
    if (bVar16) goto LAB_00105577;
    _Var13._M_current = _Var13._M_current + 1;
  }
  bVar16 = __gnu_cxx::__ops::
           _Iter_pred<threadFunc(int,int,bool*,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<cUser,std::allocator<cUser>>&)::$_0>
           ::operator()((_Iter_pred<threadFunc(int,int,bool*,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<cUser,std::allocator<cUser>>&)::__0>
                         *)&local_58,_Var13);
  __position = _Var13._M_current;
  if (!bVar16) {
    __position = currUser.field_2._8_8_;
  }
LAB_00105577:
  if (local_58 != &__str._M_string_length) {
    operator_delete(local_58);
  }
  uVar4 = currUser.field_2._8_8_;
  if (local_e0 != local_d0) {
    operator_delete(local_e0);
  }
  _Var13._M_current = (anon_struct_40_2_6a8bb0e8 *)(__position + 0x28);
  if (_Var13._M_current != (anon_struct_40_2_6a8bb0e8 *)uVar4 && __position != uVar4) {
    do {
      bVar16 = __gnu_cxx::__ops::
               _Iter_pred<threadFunc(int,int,bool*,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<cUser,std::allocator<cUser>>&)::$_0>
               ::operator()((_Iter_pred<threadFunc(int,int,bool*,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<cUser,std::allocator<cUser>>&)::__0>
                             *)local_190,_Var13);
      if (!bVar16) {
        std::__cxx11::string::operator=((string *)__position,(string *)_Var13._M_current);
        ((anon_struct_40_2_6a8bb0e8 *)__position)->id = (_Var13._M_current)->id;
        __position = __position + 0x28;
      }
      _Var13._M_current = _Var13._M_current + 1;
    } while (_Var13._M_current != (anon_struct_40_2_6a8bb0e8 *)uVar4);
  }
  if (local_190[0] != pollData[0]) {
    operator_delete((void *)local_190[0]);
  }
  if (local_c0 != (pollfd)local_b0) {
    operator_delete((void *)local_c0);
  }
  std::vector<cUser,_std::allocator<cUser>_>::_M_erase(local_88,(iterator)__position);
  if (local_110 != local_100) {
    operator_delete(local_110);
  }
  paVar15 = (local_88->super__Vector_base<cUser,_std::allocator<cUser>_>)._M_impl.
            super__Vector_impl_data._M_start;
  paVar3 = (local_88->super__Vector_base<cUser,_std::allocator<cUser>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (paVar15 != paVar3) {
    do {
      local_58 = &__str._M_string_length;
      pcVar2 = (paVar15->username)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_58,pcVar2,pcVar2 + (paVar15->username)._M_string_length);
      __str.field_2._8_4_ = paVar15->id;
      local_e0 = local_d0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_e0,local_80,currUser._M_dataplus._M_p + (long)local_80);
      std::__cxx11::string::append((char *)&local_e0);
      std::__cxx11::string::operator=
                ((string *)
                 ((local_a0->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start + (int)__str.field_2._8_4_),
                 (string *)&local_e0);
      if (local_e0 != local_d0) {
        operator_delete(local_e0);
      }
      local_98[(int)__str.field_2._8_4_] = true;
      if (local_58 != &__str._M_string_length) {
        operator_delete(local_58);
      }
      paVar15 = paVar15 + 1;
    } while (paVar15 != paVar3);
  }
LAB_00105250:
  if (unaff_R12 != (string *)0x0) {
    lVar14 = *(long *)((long)&unaff_R12[-1].field_2 + 8);
    if (lVar14 != 0) {
      paVar11 = &unaff_R12[lVar14 + -1].field_2;
      lVar14 = lVar14 * -0x20;
      do {
        pcVar2 = (((string *)(paVar11 + -1))->_M_dataplus)._M_p;
        if (paVar11 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar2) {
          operator_delete(pcVar2);
        }
        paVar11 = paVar11 + -2;
        lVar14 = lVar14 + 0x20;
      } while (lVar14 != 0);
    }
    operator_delete__((void *)((long)&unaff_R12[-1].field_2 + 8));
  }
LAB_001051df:
  close(new_fd);
  if (local_80 != (undefined1  [8])&currUser._M_string_length) {
    operator_delete((void *)local_80);
  }
  return;
}

Assistant:

void threadFunc(int id,int new_fd, bool* finished,
    bool* msgFlags, vector<string>& msgs, vector<cUser>& currUsers){

    //needed flags for user flow
    bool loginFlag = false;
    bool connectionLost = false;
    char buffer[MAXDATASIZE];
    string* cmd;
    string currUser;
    struct pollfd pollData[1];

    //set up the polling data for the sockets function
    pollData[0].fd = new_fd;
    pollData[0].events = POLLIN;


    while(1){
        //don't let anyone past unless they got that login
        while(!loginFlag){

            //Send login notice
            if (send(new_fd, "Use Command Login To Login:", 28, 0) == -1)
                perror("send");

            //get the users command
            cmd = getCommand(new_fd,pollData,msgFlags,id);

            //if the getCommand function returns null it means connection was lost
            if(cmd == NULL){
                cout << "connection with host lost" << endl;
                connectionLost = true;
                break;
            }

            //if they are all logged in set it all up
            if(cmd[0] == string("login") && login(cmd[1],new_fd,&currUser,currUsers,id, msgFlags, msgs)){
                //add the user to the current users list
                loginFlag = true;
            }
            else{
                send(new_fd, "Server: Denied. Please login first.", 40, 0);
            }
        }

        //make sure connection isn't lost during logins
        if(connectionLost){
            delete[] cmd;
            close(new_fd);
            return;
        }
        //start looping through recieving and sending messages
        if(loginFlag){
            string* cmd = getCommand(new_fd,pollData,msgFlags,id);

            //connection to the socket was lost
            if(cmd == NULL){
                cout << "Client connection lost" << endl;
                break;
            }


            //user flow to activate functions for each command
            if(cmd[0] == string("newuser")){
                newUser(cmd[1],new_fd);
            }
            else if(cmd[0] == string("msg")){
                if(send(new_fd,msgs[id].c_str(),MAXDATASIZE-1,0) == -1)
                    perror("send error");
                msgFlags[id] = false;
            }
            else if (cmd[0] == string("who")){
                who(currUsers,new_fd);
            }
            else if (cmd[0] == string("send")){
                sendMessage(cmd[1], new_fd, currUser, currUsers, msgFlags, msgs);
            }
            else if (cmd[0] == string("logout")){
                if (send(new_fd, "You are now loged out", 25, 0) == -1)
                    perror("send");

                loginFlag = false;

                cout << currUser + " logout." << endl;

                //remove the user from the list of current users
                currUsers.erase(remove_if(currUsers.begin(), currUsers.end(),[currUser](cUser u){
                    return (u.username == currUser);
                }));

                //broadcast the user has joined
                for(cUser user : currUsers){
                    msgs[user.id] = string(currUser + " left");
                    msgFlags[user.id] = true;
                }

                break;

            }
            //catch any other invalid input
            else {
                if(send((new_fd),"Invalid Command",20,0) == -1)
                    perror("send");
            }
        }
    }
    //final clean up
    delete[] cmd;
    close(new_fd);
}